

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O0

PoComp __thiscall
Kernel::TermPartialOrdering::getOneExternal(TermPartialOrdering *this,TermList t,size_t idx)

{
  undefined8 uVar1;
  bool bVar2;
  PoComp PVar3;
  int iVar4;
  Entry *this_00;
  unsigned_long *puVar5;
  TermList *pTVar6;
  unsigned_long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Result comp;
  PoComp val;
  Entry *e;
  Iterator it;
  PoComp res;
  Iterator *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  PoComp in_stack_ffffffffffffff86;
  PoComp in_stack_ffffffffffffff87;
  long *in_stack_ffffffffffffff88;
  PartialOrdering *in_stack_ffffffffffffff90;
  Iterator local_38;
  PoComp local_21;
  unsigned_long local_20;
  undefined8 local_10;
  
  local_21 = UNKNOWN;
  local_20 = in_RDX;
  local_10 = in_RSI;
  Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Iterator::Iterator
            (&local_38,(Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash> *)(in_RDI + 1));
  do {
    do {
      do {
        bVar2 = Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Iterator::hasNext
                          (in_stack_ffffffffffffff78);
        if (!bVar2) {
          return local_21;
        }
        this_00 = Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Iterator::next
                            (&local_38);
        puVar5 = Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Entry::value(this_00);
      } while (*puVar5 == local_20);
      Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Entry::value(this_00);
      PVar3 = PartialOrdering::get
                        (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
      uVar1 = local_10;
    } while (PVar3 == UNKNOWN);
    in_stack_ffffffffffffff88 = (long *)*in_RDI;
    pTVar6 = Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Entry::key(this_00);
    iVar4 = (**(code **)(*in_stack_ffffffffffffff88 + 0x18))
                      (in_stack_ffffffffffffff88,uVar1,pTVar6->_content);
    in_stack_ffffffffffffff90 = (PartialOrdering *)(ulong)(iVar4 - 1);
    switch(in_stack_ffffffffffffff90) {
    case (PartialOrdering *)0x0:
      if ((byte)(PVar3 - GREATER) < 2) {
        checkCompatibility(local_21,GREATER,&local_21);
        return local_21;
      }
      in_stack_ffffffffffffff87 = PVar3;
      if (((byte)(PVar3 - NLEQ) < 2) &&
         (checkCompatibility(local_21,NLEQ,&local_21), in_stack_ffffffffffffff87 = PVar3,
         local_21 == INCOMPARABLE)) {
        return INCOMPARABLE;
      }
      break;
    case (PartialOrdering *)0x1:
      if ((byte)(PVar3 - EQUAL) < 2) {
        checkCompatibility(local_21,LESS,&local_21);
        return local_21;
      }
      if (((PVar3 == NGEQ) || (in_stack_ffffffffffffff86 = PVar3, PVar3 == INCOMPARABLE)) &&
         (checkCompatibility(local_21,NGEQ,&local_21), in_stack_ffffffffffffff86 = PVar3,
         local_21 == INCOMPARABLE)) {
        return INCOMPARABLE;
      }
      break;
    case (PartialOrdering *)0x2:
      return PVar3;
    case (PartialOrdering *)0x3:
    }
  } while( true );
}

Assistant:

PoComp TermPartialOrdering::getOneExternal(TermList t, size_t idx) const
{
  PoComp res = PoComp::UNKNOWN;
  decltype(_nodes)::Iterator it(_nodes);
  while (it.hasNext()) {
    auto& e = it.next();
    if (e.value()==idx) {
      continue;
    }
    auto val = _po->get(e.value(),idx);
    if (val == PoComp::UNKNOWN) {
      continue;
    }
    auto comp = _ord.compare(t,e.key());
    switch (comp) {
      case Ordering::GREATER: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::GREATER:
            // t > e ≥ x -> t > x
            ALWAYS(checkCompatibility(res, PoComp::GREATER, res));
            return res;
          case PoComp::NLEQ:
          case PoComp::INCOMPARABLE:
            // t > e ≰ x -> t ≰ x
            ALWAYS(checkCompatibility(res, PoComp::NLEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::EQUAL: {
        return val;
      }
      case Ordering::LESS: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::LESS:
            // t < e ≤ x -> t < x
            ALWAYS(checkCompatibility(res, PoComp::LESS, res));
            return res;
          case PoComp::NGEQ:
          case PoComp::INCOMPARABLE:
            // t < e ≱ x -> t ≱ x
            ALWAYS(checkCompatibility(res, PoComp::NGEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::INCOMPARABLE: {
        break;
      }
    }
  }
  return res;
}